

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ConditionalExpression *expr)

{
  bool bVar1;
  Expression *this_00;
  Expression *expr_00;
  AbstractFlowAnalysis<TestAnalysis,_int> *this_01;
  ConditionalExpression *in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  int falseAfterLeft;
  int trueAfterLeft;
  bool conditionalAfterLeft;
  type_conflict1 trueState;
  anon_class_8_1_8991fb9c visitSide;
  ConstantValue cv;
  Condition *cond;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *__range3;
  int falseState;
  ConstantValue knownVal;
  Pattern *in_stack_fffffffffffffea8;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_fffffffffffffeb0;
  Expression *in_stack_fffffffffffffeb8;
  Expression *in_stack_fffffffffffffec0;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_fffffffffffffec8;
  int local_110;
  int local_10c;
  byte local_105;
  int local_104;
  reference local_60;
  Condition *local_58;
  __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
  local_50;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *local_48;
  int local_3c [11];
  ConditionalExpression *local_10;
  
  local_10 = in_RSI;
  slang::ConstantValue::ConstantValue
            ((ConstantValue *)in_stack_fffffffffffffeb0,(SVInt *)in_stack_fffffffffffffea8);
  local_3c[0] = TestAnalysis::unreachableState((TestAnalysis *)in_RDI);
  local_48 = &local_10->conditions;
  local_50._M_current =
       (Condition *)
       std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
                   *)in_stack_fffffffffffffea8);
  local_58 = (Condition *)
             std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::
             end((span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *
                 )in_stack_fffffffffffffeb8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffea8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
               ::operator*(&local_50);
    not_null<const_slang::ast::Expression_*>::operator*
              ((not_null<const_slang::ast::Expression_*> *)0x2462a9);
    visitCondition(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x2462d6);
    if ((bVar1) &&
       (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x2462f6), bVar1)) {
      bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffeb0);
      if (bVar1) {
        slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffeb0);
      }
      SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffffeb0,
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffeb0,(SVInt *)in_stack_fffffffffffffea8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffeb0,
                 (ConstantValue *)in_stack_fffffffffffffea8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x24639c);
      SVInt::~SVInt((SVInt *)in_stack_fffffffffffffec0);
    }
    else {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffeb0,
                 (ConstantValue *)in_stack_fffffffffffffea8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x246432);
    }
    if (local_60->pattern != (Pattern *)0x0) {
      visit<slang::ast::Pattern>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    TestAnalysis::joinState((TestAnalysis *)in_RDI,local_3c,&in_RDI->stateWhenFalse);
    setState(in_RDI,in_RDI->stateWhenTrue);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x246494);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
    ::operator++(&local_50);
  }
  local_104 = in_RDI->state;
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x2464d9);
  if (bVar1) {
    bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffeb0);
    if (bVar1) {
      ast::ConditionalExpression::right(local_10);
      visitExpr::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (int *)in_stack_fffffffffffffeb0);
      ast::ConditionalExpression::left(local_10);
      visitExpr::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (int *)in_stack_fffffffffffffeb0);
    }
    else {
      this_00 = ast::ConditionalExpression::left(local_10);
      visitExpr::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this_00,in_stack_fffffffffffffeb8,
                 (int *)in_stack_fffffffffffffeb0);
      expr_00 = ast::ConditionalExpression::right(local_10);
      visitExpr::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this_00,expr_00,(int *)in_stack_fffffffffffffeb0);
    }
  }
  else {
    this_01 = (AbstractFlowAnalysis<TestAnalysis,_int> *)ast::ConditionalExpression::left(local_10);
    visitExpr::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (int *)this_01);
    local_105 = in_RDI->isStateSplit & 1;
    if (local_105 == 0) {
      local_10c = TestAnalysis::copyState((TestAnalysis *)in_RDI,&in_RDI->state);
      local_110 = in_RDI->state;
    }
    else {
      local_10c = in_RDI->stateWhenTrue;
      local_110 = in_RDI->stateWhenFalse;
    }
    ast::ConditionalExpression::right(local_10);
    visitExpr::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (int *)this_01);
    if (((local_105 & 1) == 0) && ((in_RDI->isStateSplit & 1U) == 0)) {
      TestAnalysis::joinState((TestAnalysis *)in_RDI,&in_RDI->state,&local_10c);
    }
    else {
      split(this_01);
      TestAnalysis::joinState((TestAnalysis *)in_RDI,&in_RDI->stateWhenTrue,&local_10c);
      TestAnalysis::joinState((TestAnalysis *)in_RDI,&in_RDI->stateWhenFalse,&local_110);
    }
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x2466ee);
  return;
}

Assistant:

void visitExpr(const ConditionalExpression& expr) {
        // TODO: handle the special ambiguous 'x merging of both sides
        ConstantValue knownVal = SVInt::One;
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : expr.conditions) {
            auto cv = visitCondition(*cond.expr);
            if (cv && knownVal)
                knownVal = SVInt(knownVal.isTrue() && cv.isTrue() ? 1 : 0);
            else
                knownVal = nullptr;

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        auto visitSide = [this](const Expression& expr, TState&& newState) {
            setState(std::move(newState));
            visitNoJoin(expr);
        };

        auto trueState = std::move(state);
        if (knownVal) {
            // Special case: if the condition is constant, we will visit
            // the opposing side first and then essentially throw that
            // state away instead of joining it.
            if (knownVal.isTrue()) {
                visitSide(expr.right(), std::move(falseState));
                visitSide(expr.left(), std::move(trueState));
            }
            else {
                visitSide(expr.left(), std::move(trueState));
                visitSide(expr.right(), std::move(falseState));
            }
        }
        else {
            // Otherwise visit both sides and join as needed.
            visitSide(expr.left(), std::move(trueState));

            bool conditionalAfterLeft = isStateSplit;
            TState trueAfterLeft, falseAfterLeft;
            if (conditionalAfterLeft) {
                trueAfterLeft = std::move(stateWhenTrue);
                falseAfterLeft = std::move(stateWhenFalse);
            }
            else {
                trueAfterLeft = (DERIVED).copyState(state);
                falseAfterLeft = std::move(state);
            }

            visitSide(expr.right(), std::move(falseState));
            if (!conditionalAfterLeft && !isStateSplit) {
                (DERIVED).joinState(state, trueAfterLeft);
            }
            else {
                split();
                (DERIVED).joinState(stateWhenTrue, trueAfterLeft);
                (DERIVED).joinState(stateWhenFalse, falseAfterLeft);
            }
        }
    }